

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

void __thiscall wallet::OverflowRecord::Unserialize<AutoFile>(OverflowRecord *this,AutoFile *s)

{
  uint uVar1;
  long lVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ser_readdata8<AutoFile>(s);
  this->unused2 = uVar3;
  uVar4 = ser_readdata32<AutoFile>(s);
  this->page_number = uVar4;
  uVar4 = ser_readdata32<AutoFile>(s);
  this->item_len = uVar4;
  if ((this->m_header).other_endian == true) {
    uVar1 = this->page_number;
    this->page_number =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    this->item_len = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> unused2;
        s >> page_number;
        s >> item_len;

        if (m_header.other_endian) {
            page_number = internal_bswap_32(page_number);
            item_len = internal_bswap_32(item_len);
        }
    }